

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int isodate17_valid(uchar *v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  uVar8 = 0;
  lVar10 = 0;
  do {
    if ((byte)(v[lVar10] - 0x3a) < 0xf6) {
      return 0;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  iVar1 = (uint)v[1] * 100 + (uint)*v * 1000 + ((uint)v[2] + (uint)v[2] * 4) * 2;
  iVar2 = (uint)v[5] + ((uint)v[4] + (uint)v[4] * 4) * 2;
  iVar3 = (uint)v[7] + ((uint)v[6] + (uint)v[6] * 4) * 2;
  uVar4 = (uint)v[9] + ((uint)v[8] + (uint)v[8] * 4) * 2;
  uVar5 = (uint)v[0xb] + ((uint)v[10] + (uint)v[10] * 4) * 2;
  uVar6 = (uint)v[0xd] + ((uint)v[0xc] + (uint)v[0xc] * 4) * 2;
  uVar7 = (uint)v[0xf] + ((uint)v[0xe] + (uint)v[0xe] * 4) * 2;
  uVar9 = 0;
  if ((((((uVar7 != 0x210 ||
          ((uVar6 != 0x210 ||
           (uVar5 != 0x210 || (uVar4 != 0x210 || (iVar3 != 0x210 || iVar2 != 0x210)))) ||
          iVar1 + (uint)v[3] != 0xd050)) || v[0x10] != '\0') &&
        (0xfffffe6e < (iVar1 + (uint)v[3]) - 0xd94d)) &&
       (uVar9 = uVar8, 0xfffffff3 < iVar2 - 0x21dU)) &&
      ((0xffffffe0 < iVar3 - 0x230U && (uVar4 < 0x228)))) &&
     ((uVar5 < 0x24c && ((uVar6 < 0x24e && (uVar7 < 0x274)))))) {
    uVar9 = (uint)((byte)(v[0x10] + 0x30) < 0x65);
  }
  return uVar9;
}

Assistant:

static int
isodate17_valid(const unsigned char *v)
{
	/* First 16 bytes are all ASCII digits */
	for (int i = 0; i < 16; i++) {
		if (v[i] < '0' || v[i] > '9')
			return 0;
	}

	int year = (v[0] - '0') * 1000 + (v[1] - '0') * 100
		+ (v[2] - '0') * 10 + (v[3] - '0');
	int month = (v[4] - '0') * 10 + (v[5] - '0');
	int day = (v[6] - '0') * 10 + (v[7] - '0');
	int hour = (v[8] - '0') * 10 + (v[9] - '0');
	int minute = (v[10] - '0') * 10 + (v[11] - '0');
	int second = (v[12] - '0') * 10 + (v[13] - '0');
	int hundredths = (v[14] - '0') * 10 + (v[15] - '0');
	int gmt_off = (signed char)v[16];

	if (year == 0 && month == 0 && day == 0
	    && hour == 0 && minute == 0 && second == 0
	    && hundredths == 0 && gmt_off == 0)
		return 0;
	/*
	 * Sanity-test each individual field
	 */

	/* Year must be 1900-2300 */
	/* (Not specified in ECMA-119, but these seem
	   like reasonable limits. */
	if (year < 1900 || year > 2300)
		return 0;
	/* Month must be 1-12 */
	if (month < 1 || month > 12)
		return 0;
	/* Day must be 1-31 */
	if (day < 1 || day > 31)
		return 0;
	/* Hour must be 0-23 */
	if (hour > 23)
		return 0;
	/* Minute must be 0-59 */
	if (minute > 59)
		return 0;
	/* second must be 0-59 according to ECMA-119 9.1.5 */
	/* BUT: we should probably allow for the time being in UTC, which
	   allows up to 61 seconds in a minute in certain cases */
	if (second > 61)
		return 0;
	/* Hundredths must be 0-99 */
	if (hundredths > 99)
		return 0;
	/* Offset from GMT must be -48 to +52 */
	if (gmt_off < -48 || gmt_off > +52)
		return 0;

	/* All tests pass, this is OK */
	return 1;

}